

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

ngram_model_t * ngram_model_set_lookup(ngram_model_t *base,char *name)

{
  int iVar1;
  int local_2c;
  int32 i;
  ngram_model_set_t *set;
  char *name_local;
  ngram_model_t *base_local;
  
  if (name == (char *)0x0) {
    if (*(int *)&base[1].field_0x4 == -1) {
      base_local = (ngram_model_t *)0x0;
    }
    else {
      base_local = *(ngram_model_t **)(base[1].n_counts + (long)*(int *)&base[1].field_0x4 * 2);
    }
  }
  else {
    local_2c = 0;
    while ((local_2c < base[1].refcount &&
           (iVar1 = strcmp(*(char **)(*(long *)&base[1].n_1g_alloc + (long)local_2c * 8),name),
           iVar1 != 0))) {
      local_2c = local_2c + 1;
    }
    if (local_2c == base[1].refcount) {
      base_local = (ngram_model_t *)0x0;
    }
    else {
      base_local = *(ngram_model_t **)(base[1].n_counts + (long)local_2c * 2);
    }
  }
  return base_local;
}

Assistant:

ngram_model_t *
ngram_model_set_lookup(ngram_model_t * base, const char *name)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    if (name == NULL) {
        if (set->cur == -1)
            return NULL;
        else
            return set->lms[set->cur];
    }

    /* There probably won't be very many submodels. */
    for (i = 0; i < set->n_models; ++i)
        if (0 == strcmp(set->names[i], name))
            break;
    if (i == set->n_models)
        return NULL;
    return set->lms[i];
}